

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_nearest_apply_interpolation.h
# Opt level: O1

void ncnn::gridsample_nearest_apply_interpolation_p1
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  int iVar8;
  void *pvVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined4 uVar13;
  
  iVar1 = dst->c;
  if (0 < (long)iVar1) {
    iVar8 = dst->h * dst->w * dst->d;
    sVar2 = src->cstep;
    sVar3 = src->elemsize;
    pvVar4 = src->data;
    sVar5 = dst->cstep;
    sVar6 = dst->elemsize;
    pvVar9 = dst->data;
    pvVar7 = offset_value->data;
    lVar10 = 0;
    do {
      if (0 < iVar8) {
        lVar11 = 0;
        do {
          lVar12 = (long)*(int *)((long)pvVar7 + lVar11 * 4);
          if (lVar12 < 0) {
            uVar13 = 0;
          }
          else {
            uVar13 = *(undefined4 *)((long)pvVar4 + lVar12 * 4 + sVar2 * sVar3 * lVar10);
          }
          *(undefined4 *)((long)pvVar9 + lVar11 * 4) = uVar13;
          lVar11 = lVar11 + 1;
        } while (iVar8 != (int)lVar11);
      }
      lVar10 = lVar10 + 1;
      pvVar9 = (void *)((long)pvVar9 + sVar5 * sVar6);
    } while (lVar10 != iVar1);
  }
  return;
}

Assistant:

static void gridsample_nearest_apply_interpolation_p1(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int outd = dst.d;
    const int grid_size = outw * outh * outd;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const int* offset_ptr = offset_value.channel(0);

        for (int x = 0; x < grid_size; x++)
        {
            *dstptr = offset_ptr[0] >= 0 ? *(srcptr + offset_ptr[0]) : 0;

            offset_ptr++;
            dstptr++;
        }
    }
}